

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

void cram_byte_array_len_encode_free(cram_codec *c)

{
  cram_codec *c_local;
  
  if (c != (cram_codec *)0x0) {
    if ((c->field_6).e_byte_array_len.len_codec != (cram_codec *)0x0) {
      (*((c->field_6).e_byte_array_len.len_codec)->free)((c->field_6).e_byte_array_len.len_codec);
    }
    if ((c->field_6).e_byte_array_len.val_codec != (cram_codec *)0x0) {
      (*((c->field_6).e_byte_array_len.val_codec)->free)((c->field_6).e_byte_array_len.val_codec);
    }
    free(c);
  }
  return;
}

Assistant:

void cram_byte_array_len_encode_free(cram_codec *c) {
    if (!c)
	return;

    if (c->e_byte_array_len.len_codec)
	c->e_byte_array_len.len_codec->free(c->e_byte_array_len.len_codec);

    if (c->e_byte_array_len.val_codec)
	c->e_byte_array_len.val_codec->free(c->e_byte_array_len.val_codec);

    free(c);
}